

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  char cVar4;
  int iVar5;
  ImGuiID IVar6;
  ImGuiWindow *pIVar7;
  ImGuiGroupData *pIVar8;
  bool bVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  ImGuiWindow *window;
  char cVar12;
  ImGuiContext *g;
  ImGuiID IVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ImRect local_28;
  ImVec2 local_18;
  
  pIVar10 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  iVar5 = (GImGui->GroupStack).Size;
  pIVar8 = (GImGui->GroupStack).Data;
  if ((pIVar7->DC).IsSetPos == false) {
    IVar2 = (pIVar7->DC).CursorMaxPos;
  }
  else {
    (pIVar7->DC).IsSetPos = false;
    IVar2 = (pIVar7->DC).CursorPos;
    IVar3 = (pIVar7->DC).CursorMaxPos;
    fVar19 = IVar3.x;
    fVar20 = IVar3.y;
    fVar17 = IVar2.x;
    fVar18 = IVar2.y;
    uVar15 = -(uint)(fVar17 <= fVar19);
    uVar16 = -(uint)(fVar18 <= fVar20);
    IVar2 = (ImVec2)(CONCAT44(~uVar16 & (uint)fVar18,~uVar15 & (uint)fVar17) |
                    CONCAT44((uint)fVar20 & uVar16,(uint)fVar19 & uVar15));
    (pIVar7->DC).CursorMaxPos = IVar2;
  }
  local_28.Min = pIVar8[(long)iVar5 + -1].BackupCursorPos;
  fVar19 = pIVar8[(long)iVar5 + -1].BackupCursorPos.x;
  fVar20 = pIVar8[(long)iVar5 + -1].BackupCursorPos.y;
  fVar17 = IVar2.x;
  fVar18 = IVar2.y;
  uVar15 = -(uint)(fVar19 <= fVar17);
  uVar16 = -(uint)(fVar20 <= fVar18);
  local_28.Max = (ImVec2)(CONCAT44(~uVar16 & (uint)fVar20,~uVar15 & (uint)fVar19) |
                         CONCAT44((uint)fVar18 & uVar16,(uint)fVar17 & uVar15));
  (pIVar7->DC).CursorPos = local_28.Min;
  fVar19 = pIVar8[(long)iVar5 + -1].BackupCursorMaxPos.x;
  fVar20 = pIVar8[(long)iVar5 + -1].BackupCursorMaxPos.y;
  uVar15 = -(uint)(fVar17 <= fVar19);
  uVar16 = -(uint)(fVar18 <= fVar20);
  (pIVar7->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar16 & (uint)fVar18,~uVar15 & (uint)fVar17) |
               CONCAT44((uint)fVar20 & uVar16,(uint)fVar19 & uVar15));
  (pIVar7->DC).Indent.x = pIVar8[(long)iVar5 + -1].BackupIndent.x;
  (pIVar7->DC).GroupOffset.x = pIVar8[(long)iVar5 + -1].BackupGroupOffset.x;
  (pIVar7->DC).CurrLineSize = pIVar8[(long)iVar5 + -1].BackupCurrLineSize;
  (pIVar7->DC).CurrLineTextBaseOffset = pIVar8[(long)iVar5 + -1].BackupCurrLineTextBaseOffset;
  if (pIVar10->LogEnabled == true) {
    pIVar10->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar8[(long)iVar5 + -1].EmitItem != true) goto LAB_001f2240;
  fVar17 = (pIVar7->DC).PrevLineTextBaseOffset;
  uVar15 = -(uint)(pIVar8[(long)iVar5 + -1].BackupCurrLineTextBaseOffset <= fVar17);
  (pIVar7->DC).CurrLineTextBaseOffset =
       (float)(~uVar15 & (uint)pIVar8[(long)iVar5 + -1].BackupCurrLineTextBaseOffset |
              (uint)fVar17 & uVar15);
  local_18.x = local_28.Max.x - local_28.Min.x;
  local_18.y = local_28.Max.y - local_28.Min.y;
  ItemSize(&local_18,-1.0);
  ItemAdd(&local_28,0,(ImRect *)0x0,1);
  IVar6 = pIVar10->ActiveId;
  if (pIVar8[(long)iVar5 + -1].BackupActiveIdIsAlive == IVar6) {
    if (pIVar8[(long)iVar5 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar4 = pIVar10->ActiveIdPreviousFrameIsAlive;
joined_r0x001f21de:
      if (cVar4 != '\0') {
        IVar13 = pIVar10->ActiveIdPreviousFrame;
        cVar4 = '\x01';
        bVar11 = false;
        goto LAB_001f21d2;
      }
    }
    bVar9 = false;
    cVar12 = '\0';
  }
  else {
    bVar14 = pIVar10->ActiveIdIsAlive != IVar6;
    IVar13 = IVar6;
    if (pIVar8[(long)iVar5 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar4 = pIVar10->ActiveIdPreviousFrameIsAlive;
      bVar11 = true;
      if (IVar6 == 0 || bVar14) goto joined_r0x001f21de;
    }
    else {
      cVar12 = '\0';
      bVar9 = false;
      cVar4 = '\0';
      bVar11 = true;
      if (IVar6 == 0 || bVar14) goto LAB_001f21e4;
    }
LAB_001f21d2:
    bVar9 = bVar11;
    cVar12 = cVar4;
    (pIVar10->LastItemData).ID = IVar13;
  }
LAB_001f21e4:
  (pIVar10->LastItemData).Rect.Min = local_28.Min;
  (pIVar10->LastItemData).Rect.Max = local_28.Max;
  if ((pIVar8[(long)iVar5 + -1].BackupHoveredIdIsAlive == false) && (pIVar10->HoveredId != 0)) {
    pIVar1 = &(pIVar10->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar9) && (pIVar10->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar10->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar15 = (pIVar10->LastItemData).StatusFlags;
  (pIVar10->LastItemData).StatusFlags = uVar15 | 0x20;
  if ((cVar12 != '\0') && (IVar6 != pIVar10->ActiveIdPreviousFrame)) {
    (pIVar10->LastItemData).StatusFlags = uVar15 | 0x60;
  }
LAB_001f2240:
  (pIVar10->GroupStack).Size = (pIVar10->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}